

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O2

void __thiscall
TEST_WiningStateTest_ReadyHand_Test::~TEST_WiningStateTest_ReadyHand_Test
          (TEST_WiningStateTest_ReadyHand_Test *this)

{
  TEST_GROUP_CppUTestGroupWiningStateTest::~TEST_GROUP_CppUTestGroupWiningStateTest
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST(WiningStateTest, ReadyHand)
{
	addNoWiningHand();

	h.readyHand();	
	winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ReadyHand));
	CHECK_EQUAL(1, r.doubling_factor);
}